

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5AllocateSegid(Fts5Index *p,Fts5Structure *pStruct)

{
  int iVar1;
  int iVar2;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  int iId;
  u32 mask;
  int i;
  int iSeg;
  int iLvl;
  int iSegid;
  u32 aUsed [63];
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  uint local_108 [64];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_11c = 0;
  if (*(int *)(in_RDI + 0x3c) == 0) {
    if (*(int *)(in_RSI + 0x18) < 2000) {
      memset(local_108,0xaa,0xfc);
      memset(local_108,0,0xfc);
      for (local_120 = 0; local_120 < *(int *)(in_RSI + 0x1c); local_120 = local_120 + 1) {
        for (local_124 = 0; local_124 < *(int *)(in_RSI + (long)local_120 * 0x10 + 0x24);
            local_124 = local_124 + 1) {
          iVar1 = *(int *)(*(long *)(in_RSI + (long)local_120 * 0x10 + 0x28) +
                          (long)local_124 * 0x38);
          if ((iVar1 < 0x7d1) && (0 < iVar1)) {
            iVar2 = (iVar1 + -1) / 0x20;
            local_108[iVar2] = 1 << ((byte)((long)(iVar1 + -1) % 0x20) & 0x1f) | local_108[iVar2];
          }
        }
      }
      for (local_128 = 0; local_108[local_128] == 0xffffffff; local_128 = local_128 + 1) {
      }
      local_11c = 0;
      while ((local_108[local_128] & 1 << ((byte)local_11c & 0x1f)) != 0) {
        local_11c = local_11c + 1;
      }
      local_11c = local_128 * 0x20 + 1 + local_11c;
    }
    else {
      *(undefined4 *)(in_RDI + 0x3c) = 0xd;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_11c;
}

Assistant:

static int fts5AllocateSegid(Fts5Index *p, Fts5Structure *pStruct){
  int iSegid = 0;

  if( p->rc==SQLITE_OK ){
    if( pStruct->nSegment>=FTS5_MAX_SEGMENT ){
      p->rc = SQLITE_FULL;
    }else{
      /* FTS5_MAX_SEGMENT is currently defined as 2000. So the following
      ** array is 63 elements, or 252 bytes, in size.  */
      u32 aUsed[(FTS5_MAX_SEGMENT+31) / 32];
      int iLvl, iSeg;
      int i;
      u32 mask;
      memset(aUsed, 0, sizeof(aUsed));
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          int iId = pStruct->aLevel[iLvl].aSeg[iSeg].iSegid;
          if( iId<=FTS5_MAX_SEGMENT && iId>0 ){
            aUsed[(iId-1) / 32] |= (u32)1 << ((iId-1) % 32);
          }
        }
      }

      for(i=0; aUsed[i]==0xFFFFFFFF; i++);
      mask = aUsed[i];
      for(iSegid=0; mask & ((u32)1 << iSegid); iSegid++);
      iSegid += 1 + i*32;

#ifdef SQLITE_DEBUG
      for(iLvl=0; iLvl<pStruct->nLevel; iLvl++){
        for(iSeg=0; iSeg<pStruct->aLevel[iLvl].nSeg; iSeg++){
          assert_nc( iSegid!=pStruct->aLevel[iLvl].aSeg[iSeg].iSegid );
        }
      }
      assert_nc( iSegid>0 && iSegid<=FTS5_MAX_SEGMENT );

      {
        sqlite3_stmt *pIdxSelect = fts5IdxSelectStmt(p);
        if( p->rc==SQLITE_OK ){
          u8 aBlob[2] = {0xff, 0xff};
          sqlite3_bind_int(pIdxSelect, 1, iSegid);
          sqlite3_bind_blob(pIdxSelect, 2, aBlob, 2, SQLITE_STATIC);
          assert_nc( sqlite3_step(pIdxSelect)!=SQLITE_ROW );
          p->rc = sqlite3_reset(pIdxSelect);
          sqlite3_bind_null(pIdxSelect, 2);
        }
      }
#endif
    }
  }

  return iSegid;
}